

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  ImGuiContext *in_RDI;
  ImGuiContext *unaff_retaddr;
  int i_1;
  int i;
  ImGuiContext *backup_context;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  ImGuiContextHookType hook_type;
  
  pIVar3 = in_RDI;
  if (((in_RDI->IO).Fonts != (ImFontAtlas *)0x0) && ((in_RDI->FontAtlasOwnedByContext & 1U) != 0)) {
    ((in_RDI->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((ImFontAtlas *)0x1b500d);
  }
  hook_type = (ImGuiContextHookType)((ulong)pIVar3 >> 0x20);
  (in_RDI->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar3 = GImGui;
  if ((in_RDI->Initialized & 1U) != 0) {
    if (((in_RDI->SettingsLoaded & 1U) != 0) && ((in_RDI->IO).IniFilename != (char *)0x0)) {
      SetCurrentContext(in_RDI);
      SaveIniSettingsToDisk(&in_RDI->Initialized);
      SetCurrentContext(pIVar3);
    }
    CallContextHooks(unaff_retaddr,hook_type);
    for (iVar2 = 0; iVar2 < (in_RDI->Windows).Size; iVar2 = iVar2 + 1) {
      ImVector<ImGuiWindow_*>::operator[]
                ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IM_DELETE<ImGuiWindow>((ImGuiWindow *)0x1b50bc);
    }
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    in_RDI->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImGuiStorage::Clear((ImGuiStorage *)0x1b512e);
    in_RDI->NavWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredRootWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredWindow = (ImGuiWindow *)0x0;
    in_RDI->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    in_RDI->ActiveIdWindow = (ImGuiWindow *)0x0;
    in_RDI->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear
              ((ImVector<ImGuiColorMod> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImVector<ImGuiStyleMod>::clear
              ((ImVector<ImGuiStyleMod> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPopupData>::clear
              ((ImVector<ImGuiPopupData> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPopupData>::clear
              ((ImVector<ImGuiPopupData> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    for (iVar1 = 0; iVar1 < (in_RDI->Viewports).Size; iVar1 = iVar1 + 1) {
      ImVector<ImGuiViewportP_*>::operator[]
                ((ImVector<ImGuiViewportP_*> *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
      IM_DELETE<ImGuiViewportP>((ImGuiViewportP *)0x1b5229);
    }
    ImVector<ImGuiViewportP_*>::clear((ImVector<ImGuiViewportP_*> *)CONCAT44(iVar2,iVar1));
    ImPool<ImGuiTabBar>::Clear((ImPool<ImGuiTabBar> *)CONCAT44(iVar2,iVar1));
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)CONCAT44(iVar2,iVar1));
    ImVector<ImGuiShrinkWidthItem>::clear((ImVector<ImGuiShrinkWidthItem> *)CONCAT44(iVar2,iVar1));
    ImPool<ImGuiTable>::Clear((ImPool<ImGuiTable> *)CONCAT44(iVar2,iVar1));
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)CONCAT44(iVar2,iVar1));
    ImVector<ImDrawChannel>::clear((ImVector<ImDrawChannel> *)CONCAT44(iVar2,iVar1));
    ImVector<char>::clear((ImVector<char> *)CONCAT44(iVar2,iVar1));
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)CONCAT44(iVar2,iVar1));
    ImGuiInputTextState::ClearFreeMemory((ImGuiInputTextState *)CONCAT44(iVar2,iVar1));
    ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x1b52f1);
    ImVector<ImGuiSettingsHandler>::clear((ImVector<ImGuiSettingsHandler> *)CONCAT44(iVar2,iVar1));
    if (in_RDI->LogFile != (ImFileHandle)0x0) {
      if (in_RDI->LogFile != _stdout) {
        ImFileClose((ImFileHandle)0x1b533a);
      }
      in_RDI->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1b535b);
    in_RDI->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.Tables.Clear();
    g.CurrentTableStack.clear();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}